

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MidiFile.cpp
# Opt level: O0

ulong __thiscall smf::MidiFile::unpackVLV(MidiFile *this,uchar a,uchar b,uchar c,uchar d,uchar e)

{
  bool bVar1;
  ostream *this_00;
  int local_34;
  MidiFile *pMStack_30;
  int i;
  ulong output;
  int count;
  uchar local_1c;
  uchar local_1b;
  uchar bytes [5];
  uchar e_local;
  uchar d_local;
  uchar c_local;
  uchar b_local;
  uchar a_local;
  MidiFile *this_local;
  
  stack0xffffffffffffffe8 = this;
  bytes[1] = a;
  bytes[0] = b;
  local_1b = c;
  local_1c = d;
  count._3_1_ = e;
  output._6_1_ = a;
  output._7_1_ = b;
  count._0_1_ = c;
  count._1_1_ = d;
  count._2_1_ = e;
  output._0_4_ = 0;
  while( true ) {
    bVar1 = false;
    if ((int)output < 5) {
      bVar1 = 0x7f < *(byte *)((long)&output + (long)(int)output + 6);
    }
    if (!bVar1) break;
    output._0_4_ = (int)output + 1;
  }
  output._0_4_ = (int)output + 1;
  if ((int)output < 6) {
    pMStack_30 = (MidiFile *)0x0;
    for (local_34 = 0; local_34 < (int)output; local_34 = local_34 + 1) {
      pMStack_30 = (MidiFile *)
                   ((long)pMStack_30 << 7 |
                   (long)(int)(*(byte *)((long)&output + (long)local_34 + 6) & 0x7f));
    }
    this_local = pMStack_30;
  }
  else {
    this_00 = std::operator<<((ostream *)&std::cerr,"VLV number is too large");
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    this->m_rwstatus = false;
    this_local = (MidiFile *)0x0;
  }
  return (ulong)this_local;
}

Assistant:

ulong MidiFile::unpackVLV(uchar a, uchar b, uchar c, uchar d, uchar e) {
	uchar bytes[5] = {a, b, c, d, e};
	int count = 0;
	while ((count < 5) && (bytes[count] > 0x7f)) {
		count++;
	}
	count++;
	if (count >= 6) {
		std::cerr << "VLV number is too large" << std::endl;
		m_rwstatus = false;
		return 0;
	}

	ulong output = 0;
	for (int i=0; i<count; i++) {
		output = output << 7;
		output = output | (bytes[i] & 0x7f);
	}

	return output;
}